

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void linenoiseEditDeletePrevWord(linenoiseState *l)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = l->pos;
  if (sVar1 != 0) {
    sVar2 = sVar1;
    do {
      sVar2 = sVar2 - 1;
      if (l->buf[sVar2] != ' ') break;
      l->pos = sVar2;
    } while (sVar2 != 0);
  }
  sVar2 = l->pos;
  if (sVar2 != 0) {
    do {
      if (l->buf[sVar2 - 1] == ' ') goto LAB_0010b68f;
      sVar2 = sVar2 - 1;
      l->pos = sVar2;
    } while (sVar2 != 0);
    sVar2 = 0;
  }
LAB_0010b68f:
  memmove(l->buf + sVar2,l->buf + sVar1,(l->len - sVar1) + 1);
  l->len = l->len + (sVar2 - sVar1);
  linenoiseRefreshLine();
  return;
}

Assistant:

void linenoiseEditDeletePrevWord(struct linenoiseState *l) {
    size_t old_pos = l->pos;
    size_t diff;

    while (l->pos > 0 && l->buf[l->pos-1] == ' ')
        l->pos--;
    while (l->pos > 0 && l->buf[l->pos-1] != ' ')
        l->pos--;
    diff = old_pos - l->pos;
    memmove(l->buf+l->pos,l->buf+old_pos,l->len-old_pos+1);
    l->len -= diff;
    linenoiseRefreshLine();
}